

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O1

bool __thiscall
libtorrent::http_parser::parse_chunk_header
          (http_parser *this,span<const_char> buf,int64_t *chunk_size,int *header_size)

{
  char *pcVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  char cVar4;
  uint uVar5;
  char *pcVar6;
  _Rb_tree_node_base *p_Var7;
  size_type sVar8;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  bool bVar13;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar14;
  string line;
  string name;
  string value;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tail_headers;
  undefined1 *local_110;
  char *local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  int *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  char *local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  pcVar10 = buf.m_ptr;
  pcVar1 = pcVar10 + buf.m_len;
  pcVar12 = pcVar10;
  if (0 < buf.m_len) {
    pcVar12 = pcVar10 + (*pcVar10 == '\r');
  }
  if (pcVar12 < pcVar1) {
    pcVar12 = pcVar12 + (*pcVar12 == '\n');
  }
  if (pcVar12 != pcVar1) {
    local_c0.first._M_dataplus._M_p._0_1_ = 10;
    local_f0 = header_size;
    pcVar6 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (pcVar12,pcVar1);
    if (pcVar6 != pcVar1) {
      pcVar11 = pcVar6 + 1;
      *local_f0 = (int)pcVar11 - (int)buf.m_ptr;
      local_c8 = pcVar10;
      if (pcVar12 == pcVar11) {
        lVar9 = 0;
      }
      else {
        pcVar12 = pcVar12 + -1;
        lVar9 = 0;
        do {
          cVar4 = pcVar12[1];
          if ((cVar4 != '\n') && (cVar4 != '\r')) {
            if (cVar4 == ';') break;
            uVar5 = aux::hex_to_int(cVar4);
            if (((int)uVar5 < 0) || (0x7fffffffffffffe < lVar9)) {
              *chunk_size = -1;
              bVar13 = false;
            }
            else {
              lVar9 = lVar9 * 0x10 + (ulong)uVar5;
              bVar13 = true;
            }
            if (!bVar13) {
              bVar13 = false;
              goto LAB_001e1d62;
            }
          }
          pcVar12 = pcVar12 + 1;
        } while (pcVar12 != pcVar6);
      }
      bVar13 = true;
LAB_001e1d62:
      if (!bVar13) {
        return true;
      }
      *chunk_size = lVar9;
      if (lVar9 != 0) {
        return true;
      }
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_c0.first._M_dataplus._M_p._0_1_ = 10;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      pcVar12 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>(pcVar11);
      local_110 = &local_100;
      local_108 = (char *)0x0;
      local_100 = 0;
      this_00 = &this->m_header;
      do {
        bVar13 = pcVar12 == pcVar1;
        if (bVar13) break;
        std::__cxx11::string::replace((ulong)&local_110,0,local_108,(ulong)pcVar11);
        pcVar11 = pcVar12 + 1;
        lVar9 = std::__cxx11::string::find((char)&local_110,0x3a);
        if (lVar9 == -1) {
          *local_f0 = (int)pcVar11 - (int)local_c8;
          for (p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left; pcVar12 = pcVar11,
              (_Rb_tree_header *)p_Var7 != &local_60._M_impl.super__Rb_tree_header;
              p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
            pVar14 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::_M_get_insert_equal_pos(&this_00->_M_t,(key_type *)(p_Var7 + 1));
            local_c0.first._M_dataplus._M_p = (pointer)this_00;
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::
            _M_insert_<std::pair<std::__cxx11::string_const,std::__cxx11::string>const&,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::_Alloc_node>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)this_00,pVar14.first,pVar14.second,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(p_Var7 + 1),(_Alloc_node *)&local_c0);
          }
        }
        else {
          std::__cxx11::string::substr((ulong)&local_e8,(ulong)&local_110);
          sVar3 = local_e8._M_string_length;
          _Var2._M_p = local_e8._M_dataplus._M_p;
          if (local_e8._M_string_length != 0) {
            sVar8 = 0;
            do {
              cVar4 = to_lower(_Var2._M_p[sVar8]);
              _Var2._M_p[sVar8] = cVar4;
              sVar8 = sVar8 + 1;
            } while (sVar3 != sVar8);
          }
          pcVar12 = (char *)(lVar9 + 1);
          if (pcVar12 < local_108) {
            do {
              if ((local_110[(long)pcVar12] != ' ') && (local_110[(long)pcVar12] != '\t')) break;
              pcVar12 = pcVar12 + 1;
            } while (local_108 != pcVar12);
          }
          std::__cxx11::string::substr((ulong)&local_80,(ulong)&local_110);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (&local_c0,&local_e8,&local_80);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&local_60,&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0.second._M_dataplus._M_p != &local_c0.second.field_2) {
            operator_delete(local_c0.second._M_dataplus._M_p,
                            local_c0.second.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0.first._M_dataplus._M_p != &local_c0.first.field_2) {
            operator_delete(local_c0.first._M_dataplus._M_p,
                            local_c0.first.field_2._M_allocated_capacity + 1);
          }
          local_c0.first._M_dataplus._M_p._0_1_ = 10;
          pcVar12 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                              (pcVar11,pcVar1,&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
        }
      } while (lVar9 != -1);
      if (local_110 != &local_100) {
        operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
      return !bVar13;
    }
  }
  return false;
}

Assistant:

bool http_parser::parse_chunk_header(span<char const> buf
		, std::int64_t* chunk_size, int* header_size)
	{
		char const* pos = buf.data();

		// ignore one optional new-line. This is since each chunk
		// is terminated by a newline. we're likely to see one
		// before the actual header.

		if (pos < buf.end() && pos[0] == '\r') ++pos;
		if (pos < buf.end() && pos[0] == '\n') ++pos;
		if (pos == buf.end()) return false;

		TORRENT_ASSERT(pos <= buf.end());
		char const* newline = std::find(pos, buf.end(), '\n');
		if (newline == buf.end()) return false;
		++newline;

		// the chunk header is a single line, a hex length of the
		// chunk followed by an optional semi-colon with a comment
		// in case the length is 0, the stream is terminated and
		// there are extra tail headers, which is terminated by an
		// empty line

		*header_size = int(newline - buf.data());

		// first, read the chunk length
		std::int64_t size = 0;
		for (char const* i = pos; i != newline; ++i)
		{
			if (*i == '\r') continue;
			if (*i == '\n') continue;
			if (*i == ';') break;
			int const digit = aux::hex_to_int(*i);
			if (digit < 0)
			{
				*chunk_size = -1;
				return true;
			}
			if (size >= std::numeric_limits<std::int64_t>::max() / 16)
			{
				*chunk_size = -1;
				return true;
			}
			size *= 16;
			size += digit;
		}
		*chunk_size = size;

		if (*chunk_size != 0)
		{
			// the newline is at least 1 byte, and the length-prefix is at least 1
			// byte
			TORRENT_ASSERT(newline - buf.data() >= 2);
			return true;
		}

		// this is the terminator of the stream. Also read headers
		std::map<std::string, std::string> tail_headers;
		pos = newline;
		newline = std::find(pos, buf.end(), '\n');

		std::string line;
		while (newline != buf.end())
		{
			// if the LF character is preceded by a CR
			// character, don't copy it into the line string.
			char const* line_end = newline;
			if (pos != line_end && *(line_end - 1) == '\r') --line_end;
			line.assign(pos, line_end);
			++newline;
			pos = newline;

			std::string::size_type separator = line.find(':');
			if (separator == std::string::npos)
			{
				// this means we got a blank line,
				// the header is finished and the body
				// starts.
				*header_size = int(newline - buf.data());

				// the newline alone is two bytes
				TORRENT_ASSERT(newline - buf.data() > 2);

				// we were successful in parsing the headers.
				// add them to the headers in the parser
				for (auto const& p : tail_headers)
					m_header.insert(p);

				return true;
			}

			std::string name = line.substr(0, separator);
			std::transform(name.begin(), name.end(), name.begin(), &to_lower);
			++separator;
			// skip whitespace
			while (separator < line.size()
				&& (line[separator] == ' ' || line[separator] == '\t'))
				++separator;
			std::string value = line.substr(separator, std::string::npos);
			tail_headers.insert(std::make_pair(name, value));
//			std::fprintf(stderr, "tail_header: %s: %s\n", name.c_str(), value.c_str());

			newline = std::find(pos, buf.end(), '\n');
		}
		return false;
	}